

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matchit.h
# Opt level: O3

bool __thiscall
matchit::impl::Id<mathiu::impl::Difference>::matchValue<mathiu::impl::Difference_const&>
          (Id<mathiu::impl::Difference> *this,Difference *v)

{
  __visit_result_t<matchit::impl::Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1173:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1175:45),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1179:45)>,_const_std::variant<std::monostate,_mathiu::impl::Difference,_mathiu::impl::Difference_*,_const_mathiu::impl::Difference_*>_&>
  _Var1;
  bool bVar2;
  __visit_result_t<matchit::impl::Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1321:44)>,_std::variant<matchit::impl::IdBlock<mathiu::impl::Difference>,_matchit::impl::IdBlock<mathiu::impl::Difference>_*>_&>
  pIVar3;
  __visit_result_t<matchit::impl::Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1186:30),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1187:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1188:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1189:33)>,_const_std::variant<std::monostate,_mathiu::impl::Difference,_mathiu::impl::Difference_*,_const_mathiu::impl::Difference_*>_&>
  pDVar4;
  long lVar5;
  bool bVar6;
  Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1321:44)>
  local_1d;
  Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1173:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1175:45),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1179:45)>
  local_1c;
  Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1321:44)>
  local_1b;
  Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1186:30),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1187:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1188:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1189:33)>
  local_1a;
  Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1321:44)>
  local_19;
  
  pIVar3 = std::
           visit<matchit::impl::Overload<matchit::impl::Id<mathiu::impl::Difference>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::Difference>&)_1_,matchit::impl::Id<mathiu::impl::Difference>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::Difference>*)_1_>,std::variant<matchit::impl::IdBlock<mathiu::impl::Difference>,matchit::impl::IdBlock<mathiu::impl::Difference>*>&>
                     (&local_1d,&this->mBlock);
  _Var1 = std::
          visit<matchit::impl::Overload<matchit::impl::IdBlock<mathiu::impl::Difference>::hasValue()const::_lambda(mathiu::impl::Difference_const&)_1_,matchit::impl::IdBlock<mathiu::impl::Difference>::hasValue()const::_lambda(mathiu::impl::Difference_const*)_1_,matchit::impl::IdBlock<mathiu::impl::Difference>::hasValue()const::_lambda(std::monostate_const&)_1_>,std::variant<std::monostate,mathiu::impl::Difference,mathiu::impl::Difference*,mathiu::impl::Difference_const*>const&>
                    (&local_1c,&(pIVar3->super_IdBlockBase<mathiu::impl::Difference>).mVariant);
  if (_Var1) {
    pIVar3 = std::
             visit<matchit::impl::Overload<matchit::impl::Id<mathiu::impl::Difference>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::Difference>&)_1_,matchit::impl::Id<mathiu::impl::Difference>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::Difference>*)_1_>,std::variant<matchit::impl::IdBlock<mathiu::impl::Difference>,matchit::impl::IdBlock<mathiu::impl::Difference>*>&>
                       (&local_1b,&this->mBlock);
    pDVar4 = std::
             visit<matchit::impl::Overload<matchit::impl::IdBlock<mathiu::impl::Difference>::get()const::_lambda(mathiu::impl::Difference_const&)_1_,matchit::impl::IdBlock<mathiu::impl::Difference>::get()const::_lambda(mathiu::impl::Difference_const*)_1_,matchit::impl::IdBlock<mathiu::impl::Difference>::get()const::_lambda(mathiu::impl::Difference*)_1_,matchit::impl::IdBlock<mathiu::impl::Difference>::get()const::_lambda(std::monostate_const&)_1_>,std::variant<std::monostate,mathiu::impl::Difference,mathiu::impl::Difference*,mathiu::impl::Difference_const*>const&>
                       (&local_1a,&(pIVar3->super_IdBlockBase<mathiu::impl::Difference>).mVariant);
    lVar5 = 0;
    do {
      bVar2 = mathiu::impl::equal((ExprPtr *)
                                  ((long)&(pDVar4->super_ExprPtrArray<2>)._M_elems[0].
                                          super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr + lVar5),
                                  (ExprPtr *)
                                  ((long)&(v->super_ExprPtrArray<2>)._M_elems[0].
                                          super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr + lVar5));
      if (!bVar2) {
        return bVar2;
      }
      bVar6 = lVar5 != 0x10;
      lVar5 = lVar5 + 0x10;
    } while (bVar6);
  }
  else {
    pIVar3 = std::
             visit<matchit::impl::Overload<matchit::impl::Id<mathiu::impl::Difference>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::Difference>&)_1_,matchit::impl::Id<mathiu::impl::Difference>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::Difference>*)_1_>,std::variant<matchit::impl::IdBlock<mathiu::impl::Difference>,matchit::impl::IdBlock<mathiu::impl::Difference>*>&>
                       (&local_19,&this->mBlock);
    IdUtil<mathiu::impl::Difference>::bindValue<mathiu::impl::Difference_const&>
              (&(pIVar3->super_IdBlockBase<mathiu::impl::Difference>).mVariant,v);
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

constexpr auto
                matchValue(Value &&v) const
            {
                if (hasValue())
                {
                    return IdTraits<std::decay_t<Type>>::equal(internalValue(), v);
                }
                IdUtil<Type>::bindValue(block().variant(), std::forward<Value>(v),
                                   StorePointer<Type, Value>{});
                return true;
            }